

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

resp_data * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
          (resp_data *__return_storage_ptr__,LazyAwaiterBase<cinatra::resp_data> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  size_t sVar12;
  size_t sVar13;
  uint64_t uVar14;
  bool bVar15;
  undefined3 uVar16;
  resp_data *prVar17;
  
  prVar17 = LazyPromise<cinatra::resp_data>::result
                      ((LazyPromise<cinatra::resp_data> *)((long)(this->_handle).__handle_ + 0x10));
  uVar1 = *(undefined4 *)&(prVar17->net_err).field_0x4;
  uVar2 = *(undefined4 *)&(prVar17->net_err)._M_cat;
  uVar3 = *(undefined4 *)((long)&(prVar17->net_err)._M_cat + 4);
  iVar4 = prVar17->status;
  bVar15 = prVar17->eof;
  uVar16 = *(undefined3 *)&prVar17->field_0x15;
  sVar12 = (prVar17->resp_body)._M_len;
  uVar5 = *(undefined4 *)((long)&(prVar17->resp_body)._M_len + 4);
  uVar6 = *(undefined4 *)&(prVar17->resp_body)._M_str;
  uVar7 = *(undefined4 *)((long)&(prVar17->resp_body)._M_str + 4);
  uVar8 = *(undefined4 *)&(prVar17->resp_headers)._M_ptr;
  uVar9 = *(undefined4 *)((long)&(prVar17->resp_headers)._M_ptr + 4);
  sVar13 = (prVar17->resp_headers)._M_extent._M_extent_value;
  uVar10 = *(undefined4 *)((long)&(prVar17->resp_headers)._M_extent._M_extent_value + 4);
  uVar14 = prVar17->total;
  uVar11 = *(undefined4 *)((long)&prVar17->total + 4);
  (__return_storage_ptr__->net_err)._M_value = (prVar17->net_err)._M_value;
  *(undefined4 *)&(__return_storage_ptr__->net_err).field_0x4 = uVar1;
  *(undefined4 *)&(__return_storage_ptr__->net_err)._M_cat = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->net_err)._M_cat + 4) = uVar3;
  __return_storage_ptr__->status = iVar4;
  __return_storage_ptr__->eof = bVar15;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = uVar16;
  *(int *)&(__return_storage_ptr__->resp_body)._M_len = (int)sVar12;
  *(undefined4 *)((long)&(__return_storage_ptr__->resp_body)._M_len + 4) = uVar5;
  *(undefined4 *)&(__return_storage_ptr__->resp_body)._M_str = uVar6;
  *(undefined4 *)((long)&(__return_storage_ptr__->resp_body)._M_str + 4) = uVar7;
  *(undefined4 *)&(__return_storage_ptr__->resp_headers)._M_ptr = uVar8;
  *(undefined4 *)((long)&(__return_storage_ptr__->resp_headers)._M_ptr + 4) = uVar9;
  *(int *)&(__return_storage_ptr__->resp_headers)._M_extent._M_extent_value = (int)sVar13;
  *(undefined4 *)((long)&(__return_storage_ptr__->resp_headers)._M_extent._M_extent_value + 4) =
       uVar10;
  *(int *)&__return_storage_ptr__->total = (int)uVar14;
  *(undefined4 *)((long)&__return_storage_ptr__->total + 4) = uVar11;
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }